

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extralev.c
# Opt level: O3

void makeroguerooms(level *lev)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uchar *puVar6;
  uint uVar7;
  uchar *puVar8;
  long lVar9;
  ulong uVar10;
  rogueroom (*parVar11) [3];
  rogueroom *prVar12;
  ulong uVar13;
  int lowy;
  long lVar14;
  long lVar15;
  
  lev->nroom = 0;
  lVar14 = 0x328d15;
  lVar15 = 0;
  do {
    uVar7 = (lVar15 == 2) + 3;
    lVar9 = 0;
    do {
      uVar4 = mt_random();
      if (uVar4 * -0x33333333 < 0x33333334) {
        if ((lev->nroom == 0) && (lVar15 == 2 || lVar9 == 0x48)) goto LAB_0019d4ef;
        *(undefined1 *)(lVar14 + -1 + lVar9) = 0;
        uVar4 = mt_random();
        *(char *)(lVar14 + -5 + lVar9) =
             ((char)uVar4 -
             ((char)(uVar4 / 0x16) + (char)(uVar4 / 0x16) * '\x14' + (char)(uVar4 / 0x16))) + '\x02'
        ;
        uVar4 = mt_random();
        *(char *)(lVar14 + -4 + lVar9) = (char)(uVar4 % uVar7) + '\x02';
      }
      else {
LAB_0019d4ef:
        *(undefined1 *)(lVar14 + -1 + lVar9) = 1;
        uVar4 = mt_random();
        *(char *)(lVar14 + -3 + lVar9) =
             ((char)uVar4 -
             ((char)(uVar4 / 0x16) + (char)(uVar4 / 0x16) * '\x14' + (char)(uVar4 / 0x16))) + '\x02'
        ;
        uVar4 = mt_random();
        *(char *)(lVar14 + -2 + lVar9) = (char)(uVar4 % uVar7) + '\x02';
        cVar1 = *(char *)(lVar14 + -3 + lVar9);
        uVar4 = mt_random();
        *(char *)(lVar14 + -5 + lVar9) =
             SUB161(ZEXT416(uVar4) % SEXT816(0x18 - (long)cVar1),0) + '\x01';
        cVar1 = *(char *)(lVar14 + -2 + lVar9);
        uVar4 = mt_random();
        *(char *)(lVar14 + -4 + lVar9) =
             SUB161(ZEXT416(uVar4) % SEXT816((long)(((ulong)(lVar15 == 2) + 5) - (long)cVar1)),0) +
             '\x01';
        lev->nroom = lev->nroom + 1;
      }
      *(undefined1 *)(lVar14 + lVar9) = 0;
      lVar9 = lVar9 + 0x24;
    } while (lVar9 != 0x6c);
    lVar15 = lVar15 + 1;
    lVar14 = lVar14 + 0xc;
    if (lVar15 == 3) {
      uVar7 = mt_random();
      uVar4 = mt_random();
      miniwalk(uVar7 % 3,uVar4 % 3);
      lev->nroom = 0;
      parVar11 = r;
      lVar14 = 0;
      do {
        lVar15 = 0;
        prVar12 = *parVar11;
        do {
          if (prVar12->real != '\0') {
            iVar5 = lev->nroom;
            prVar12->nroom = iVar5;
            smeq[iVar5] = iVar5;
            iVar5 = (int)((rogueroom *)&prVar12->rlx)->rlx;
            lowy = (int)prVar12->rly + (int)lVar14 * 7;
            cVar1 = prVar12->dx;
            cVar2 = prVar12->dy;
            uVar7 = mt_random();
            add_room(lev,(int)lVar15 + iVar5 + 1,lowy,cVar1 + iVar5 + (int)lVar15,cVar2 + lowy + -1,
                     uVar7 * -0x49249249 < 0x24924925,'\0','\0');
          }
          lVar15 = lVar15 + 0x1a;
          prVar12 = prVar12 + 3;
        } while (lVar15 != 0x4e);
        lVar14 = lVar14 + 1;
        parVar11 = (rogueroom (*) [3])((long)parVar11 + 0xc);
      } while (lVar14 != 3);
      puVar6 = &r[0][0].doortable;
      uVar10 = 0;
      do {
        uVar13 = 0;
        puVar8 = puVar6;
        do {
          bVar3 = *puVar8;
          if ((bVar3 & 2) != 0) {
            roguecorr(lev,(int)uVar13,(int)uVar10,2);
            bVar3 = *puVar8;
          }
          if ((bVar3 & 8) != 0) {
            roguecorr(lev,(int)uVar13,(int)uVar10,8);
            bVar3 = *puVar8;
          }
          if ((bVar3 & 4) != 0) {
            impossible("left end of %d, %d never connected?",uVar13 & 0xffffffff,uVar10 & 0xffffffff
                      );
            bVar3 = *puVar8;
          }
          if ((bVar3 & 1) != 0) {
            impossible("up end of %d, %d never connected?",uVar13 & 0xffffffff,uVar10 & 0xffffffff);
          }
          uVar13 = uVar13 + 1;
          puVar8 = puVar8 + 0x24;
        } while (uVar13 != 3);
        uVar10 = uVar10 + 1;
        puVar6 = puVar6 + 0xc;
      } while (uVar10 != 3);
      return;
    }
  } while( true );
}

Assistant:

void makeroguerooms(struct level *lev) {
	int x,y;
	/* Rogue levels are structured 3 by 3, with each section containing
	 * a room or an intersection.  The minimum width is 2 each way.
	 * One difference between these and "real" Rogue levels: real Rogue
	 * uses 24 rows and this game only 23.  So we cheat a bit by making
	 * the second row of rooms not as deep.
	 *
	 * Each normal space has 6/7 rows and 25 columns in which a room may
	 * actually be placed.  Walls go from rows 0-5/6 and columns 0-24.
	 * Not counting walls, the room may go in
	 * rows 1-5 and columns 1-23 (numbering starting at 0).  A room
	 * coordinate of this type may be converted to a level coordinate
	 * by adding 1+28*x to the column, and 7*y to the row.  (The 1
	 * is because column 0 isn't used [we only use 1-78]).
	 * Room height may be 2-4 (2-5 on last row), length 2-23 (not
	 * counting walls)
	 */
#define here r[x][y]

	lev->nroom = 0;
	for (y=0; y<3; y++) for(x=0; x<3; x++) {
		/* Note: we want to insure at least 1 room.  So, if the
		 * first 8 are all dummies, force the last to be a room.
		 */
		if (!rn2(5) && (lev->nroom || (x<2 && y<2))) {
			/* Arbitrary: dummy rooms may only go where real
			 * ones do.
			 */
			here.real = FALSE;
			here.rlx = rn1(22, 2);
			here.rly = rn1((y==2)?4:3, 2);
		} else {
			here.real = TRUE;
			here.dx = rn1(22, 2); /* 2-23 long, plus walls */
			here.dy = rn1((y==2)?4:3, 2); /* 2-5 high, plus walls */

			/* boundaries of room floor */
			here.rlx = rnd(23 - here.dx + 1);
			here.rly = rnd(((y==2) ? 5 : 4)- here.dy + 1);
			lev->nroom++;
		}
		here.doortable = 0;
	}
	x = rn2(3);
	y = rn2(3);
	miniwalk(x, y);
	lev->nroom = 0;
	for (y=0; y<3; y++) for(x=0; x<3; x++) {
		if (here.real) { /* Make a room */
			int lowx, lowy, hix, hiy;

			r[x][y].nroom = lev->nroom;
			smeq[lev->nroom] = lev->nroom;

			lowx = 1 + 26*x + here.rlx;
			lowy = 7*y + here.rly;
			hix = 1 + 26*x + here.rlx + here.dx - 1;
			hiy = 7*y + here.rly + here.dy - 1;
			/* Strictly speaking, it should be lit only if above
			 * level 10, but since Rogue rooms are only
			 * encountered below level 10, use !rn2(7).
			 */
			add_room(lev, lowx, lowy, hix, hiy,
				 (boolean) !rn2(7), OROOM, FALSE);
		}
	}

	/* Now, add connecting corridors. */
	for (y=0; y<3; y++) for(x=0; x<3; x++) {
		if (here.doortable & DOWN)
			roguecorr(lev, x, y, DOWN);
		if (here.doortable & RIGHT)
			roguecorr(lev, x, y, RIGHT);
		if (here.doortable & LEFT)
			impossible ("left end of %d, %d never connected?",x,y);
		if (here.doortable & UP)
			impossible ("up end of %d, %d never connected?",x,y);
	}
}